

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radial_factory.hpp
# Opt level: O0

radial_grid_ptr __thiscall
IntegratorXX::RadialFactory::generate(RadialFactory *this,RadialQuad rq,RadialTraits *traits)

{
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  radial_grid_ptr rVar2;
  unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>_>_>
  local_50;
  unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>_>
  local_48;
  unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>_>
  local_40 [3];
  unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>_>_>
  local_28;
  RadialTraits *local_20;
  RadialTraits *traits_local;
  RadialFactory *pRStack_10;
  RadialQuad rq_local;
  
  local_20 = traits;
  traits_local._4_4_ = rq;
  pRStack_10 = this;
  if (rq == Becke) {
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)&local_28);
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
                *)this,&local_28);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>_>_>
    ::~unique_ptr(&local_28);
    _Var1._M_pi = extraout_RDX;
  }
  else if (rq == MurrayHandyLaming) {
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)&local_48);
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
                *)this,&local_48);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>_>
    ::~unique_ptr(&local_48);
    _Var1._M_pi = extraout_RDX_01;
  }
  else if (rq == MuraKnowles) {
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)local_40);
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
                *)this,local_40);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>_>
    ::~unique_ptr(local_40);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    if (rq != TreutlerAhlrichs) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unsupported Radial Quadrature");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)&local_50);
    std::
    shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
    ::
    shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>,void>
              ((shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>>
                *)this,&local_50);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>_>_>
    ::~unique_ptr(&local_50);
    _Var1._M_pi = extraout_RDX_02;
  }
  rVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  rVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (radial_grid_ptr)
         rVar2.
         super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

RadialFactory::radial_grid_ptr RadialFactory::generate(RadialQuad rq, const RadialTraits& traits) {

  switch(rq) {
    case RadialQuad::Becke:
      return std::make_unique<bk_type>(traits);
    case RadialQuad::MuraKnowles:
      return std::make_unique<mk_type>(traits);
    case RadialQuad::MurrayHandyLaming:
      return std::make_unique<mhl_type>(traits);
    case RadialQuad::TreutlerAhlrichs:
      return std::make_unique<ta_type>(traits);
    default:
      throw std::runtime_error("Unsupported Radial Quadrature");
      abort();
  } 
}